

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObserverPtr.cpp
# Opt level: O0

void Rml::Detail::InitializeObserverPtrPool(void)

{
  ObserverPtrData *this;
  
  if (observer_ptr_data == (ObserverPtrData *)0x0) {
    this = (ObserverPtrData *)operator_new(0x30);
    ObserverPtrData::ObserverPtrData(this);
    observer_ptr_data = this;
  }
  observer_ptr_data->is_shutdown = false;
  return;
}

Assistant:

void Detail::InitializeObserverPtrPool()
{
	if (!observer_ptr_data)
		observer_ptr_data = new ObserverPtrData;
	observer_ptr_data->is_shutdown = false;
}